

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue val;
  JSValue obj;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue obj_00;
  JSValue func_obj;
  JSValue ctor;
  JSValue method;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue this_obj_01;
  JSValue obj_01;
  JSValue v_07;
  JSValue JVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int in_ECX;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar4;
  JSValue JVar5;
  int mapping;
  int done;
  int64_t len;
  int64_t k;
  JSValue v2;
  JSValue v;
  JSValue arr;
  JSValue iter;
  JSValue stack [2];
  JSValue args [2];
  JSValue this_arg;
  JSValue mapfn;
  JSValue items;
  JSValue r;
  JSValue v_1;
  JSContext *in_stack_fffffffffffffd30;
  JSContext *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd44;
  int64_t *in_stack_fffffffffffffd48;
  JSValueUnion in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  JSContext *in_stack_fffffffffffffd60;
  JSValueUnion in_stack_fffffffffffffd68;
  JSValueUnion in_stack_fffffffffffffd70;
  int64_t in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar6;
  BOOL in_stack_fffffffffffffd84;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  JSContext *in_stack_fffffffffffffd90;
  JSValueUnion in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  JSValueUnion in_stack_fffffffffffffdb0;
  JSValueUnion in_stack_fffffffffffffdb8;
  JSContext *in_stack_fffffffffffffdc0;
  JSValueUnion JVar8;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  BOOL is_exception_pending;
  int64_t in_stack_fffffffffffffdd0;
  JSValueUnion JVar9;
  int flags;
  uint uStack_1ec;
  int iVar10;
  int in_stack_fffffffffffffe54;
  BOOL *in_stack_fffffffffffffe58;
  undefined4 local_1a0;
  JSAtom in_stack_fffffffffffffe7c;
  JSContext *in_stack_fffffffffffffe80;
  int64_t iVar11;
  JSValueUnion in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffea0;
  undefined4 in_stack_ffffffffffffff20;
  JSValueUnion local_c0;
  int64_t local_b8;
  JSValueUnion local_90;
  int64_t local_88;
  undefined4 uStack_6c;
  JSValueUnion local_60;
  JSValueUnion local_58;
  JSValueUnion local_30;
  JSValueUnion local_28;
  undefined4 uStack_c;
  
  JVar5 = *in_R8;
  iVar10 = 0;
  JVar9.ptr = (void *)((ulong)uStack_1ec << 0x20);
  iVar11 = 3;
  if ((in_ECX < 2) || (iVar3 = JS_IsUndefined(in_R8[1]), iVar3 != 0)) {
LAB_001c531a:
    obj_01.tag = in_stack_fffffffffffffea0;
    obj_01.u.float64 = in_stack_fffffffffffffe98.float64;
    this_obj_01.tag = iVar11;
    this_obj_01.u.ptr = JVar9.ptr;
    JVar4 = JS_GetPropertyInternal
                      (in_stack_fffffffffffffe80,obj_01,in_stack_fffffffffffffe7c,this_obj_01,
                       in_stack_ffffffffffffff20);
    local_90 = JVar4.u;
    local_88 = JVar4.tag;
    flags = JVar4.u._0_4_;
    uVar6 = JVar4.u._4_4_;
    iVar3 = JS_IsException(JVar4);
    if (iVar3 == 0) {
      v_07.tag = local_88;
      v_07.u.float64 = local_90.float64;
      iVar3 = JS_IsUndefined(v_07);
      if (iVar3 == 0) {
        v_00.tag._0_4_ = in_stack_fffffffffffffd40;
        v_00.u.ptr = in_stack_fffffffffffffd38;
        v_00.tag._4_4_ = in_stack_fffffffffffffd44;
        JS_FreeValue(in_stack_fffffffffffffd30,v_00);
        JVar4 = JS_NewArray(in_stack_fffffffffffffd30);
        JVar9 = JVar4.u;
        iVar11 = JVar4.tag;
        iVar3 = JS_IsException(JVar4);
        if (iVar3 == 0) {
          JVar5 = JS_DupValue(in_RDI,JVar5);
          JVar8 = JVar5.u;
          uVar7 = (undefined4)JVar5.tag;
          is_exception_pending = JVar5.tag._4_4_;
          iVar3 = js_for_of_start(in_stack_fffffffffffffd90,
                                  (JSValue *)
                                  CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                                  in_stack_fffffffffffffd84);
          if (iVar3 == 0) {
            do {
              in_stack_fffffffffffffd30 = (JSContext *)&stack0xfffffffffffffe54;
              enum_obj.u._4_4_ = is_exception_pending;
              enum_obj.u.int32 = uVar7;
              enum_obj.tag = (int64_t)JVar9.ptr;
              method.tag = (int64_t)JVar8.ptr;
              method.u.float64 = in_stack_fffffffffffffdb8.float64;
              JVar4 = JS_IteratorNext((JSContext *)in_stack_fffffffffffffdb0.ptr,enum_obj,method,
                                      in_stack_fffffffffffffdac,
                                      (JSValue *)CONCAT44(in_stack_fffffffffffffe54,iVar10),
                                      in_stack_fffffffffffffe58);
              in_stack_fffffffffffffdb0 = JVar4.u;
              in_stack_fffffffffffffdb8 = (JSValueUnion)JVar4.tag;
              iVar3 = JS_IsException(JVar4);
              if (iVar3 != 0) break;
              if (in_stack_fffffffffffffe54 != 0) goto LAB_001c5679;
              this_obj.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
              this_obj.u.float64 = in_stack_fffffffffffffd68.float64;
              val.u._4_4_ = in_stack_fffffffffffffd5c;
              val.u.int32 = in_stack_fffffffffffffd58;
              val.tag = (int64_t)in_stack_fffffffffffffd60;
              iVar3 = JS_DefinePropertyValueInt64
                                ((JSContext *)in_stack_fffffffffffffd50.ptr,this_obj,
                                 (int64_t)in_stack_fffffffffffffd48,val,flags);
            } while (-1 < iVar3);
            iVar10 = JS_IsUndefined(JVar5);
            if (iVar10 == 0) {
              enum_obj_00.tag._0_4_ = flags;
              enum_obj_00.u = (JSValueUnion)iVar11;
              enum_obj_00.tag._4_4_ = uVar6;
              JS_IteratorClose((JSContext *)JVar9.ptr,enum_obj_00,is_exception_pending);
            }
          }
        }
      }
      else {
        JVar5.u._4_4_ = in_stack_fffffffffffffdcc;
        JVar5.u.int32 = in_stack_fffffffffffffdc8;
        JVar5.tag = in_stack_fffffffffffffdd0;
        JVar5 = JS_ToObject(in_stack_fffffffffffffdc0,JVar5);
        in_stack_fffffffffffffda0 = JVar5.u;
        iVar3 = JS_IsException(JVar5);
        if (iVar3 == 0) {
LAB_001c5679:
          obj.u._4_4_ = in_stack_fffffffffffffd5c;
          obj.u.int32 = in_stack_fffffffffffffd58;
          obj.tag = (int64_t)in_stack_fffffffffffffd60;
          iVar3 = js_get_length64((JSContext *)in_stack_fffffffffffffd50.ptr,
                                  in_stack_fffffffffffffd48,obj);
          if (-1 < iVar3) {
            if (in_stack_fffffffffffffe58 == (BOOL *)(long)(int)in_stack_fffffffffffffe58) {
              local_30._4_4_ = uStack_c;
              local_30.int32 = (int)in_stack_fffffffffffffe58;
              local_28.float64 = 0.0;
            }
            else {
              JVar5 = __JS_NewFloat64(in_RDI,(double)(long)in_stack_fffffffffffffe58);
              local_60 = JVar5.u;
              local_30 = local_60;
              local_58 = (JSValueUnion)JVar5.tag;
              local_28 = local_58;
            }
            ctor.tag = (int64_t)in_stack_fffffffffffffda0.ptr;
            ctor.u.float64 = local_28.float64;
            JVar5 = js_typed_array_create
                              ((JSContext *)local_30.ptr,ctor,in_stack_fffffffffffffd8c,
                               (JSValue *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            uVar6 = JVar5.u._0_4_;
            uVar7 = JVar5.u._4_4_;
            local_c0 = JVar5.u;
            local_b8 = JVar5.tag;
            v_01.tag._0_4_ = in_stack_fffffffffffffd40;
            v_01.u.ptr = in_stack_fffffffffffffd38;
            v_01.tag._4_4_ = in_stack_fffffffffffffd44;
            JS_FreeValue(in_stack_fffffffffffffd30,v_01);
            iVar3 = JS_IsException(JVar5);
            if (iVar3 == 0) {
              for (_local_1a0 = 0; _local_1a0 < (long)in_stack_fffffffffffffe58;
                  _local_1a0 = _local_1a0 + 1) {
                obj_00.tag._0_4_ = uVar6;
                obj_00.u = (JSValueUnion)in_stack_fffffffffffffd78;
                obj_00.tag._4_4_ = uVar7;
                JVar5 = JS_GetPropertyInt64((JSContext *)in_stack_fffffffffffffd70.ptr,obj_00,
                                            (int64_t)in_stack_fffffffffffffd68);
                in_stack_fffffffffffffd70 = JVar5.u;
                in_stack_fffffffffffffd78 = JVar5.tag;
                iVar3 = JS_IsException(JVar5);
                if (iVar3 != 0) goto LAB_001c5aee;
                if (iVar10 != 0) {
                  in_stack_fffffffffffffd60 = (JSContext *)CONCAT44(uStack_6c,local_1a0);
                  in_stack_fffffffffffffd68.float64 = 0.0;
                  func_obj.tag._0_4_ = uVar6;
                  func_obj.u.ptr = (void *)in_stack_fffffffffffffd78;
                  func_obj.tag._4_4_ = uVar7;
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = in_stack_fffffffffffffd70;
                  JVar5 = JS_Call(in_stack_fffffffffffffd60,func_obj,(JSValue)(auVar2 << 0x40),
                                  in_stack_fffffffffffffd5c,(JSValue *)in_stack_fffffffffffffda0.ptr
                                 );
                  in_stack_fffffffffffffd50 = JVar5.u;
                  in_stack_fffffffffffffd58 = (undefined4)JVar5.tag;
                  in_stack_fffffffffffffd5c = JVar5.tag._4_4_;
                  v_02.tag._0_4_ = in_stack_fffffffffffffd40;
                  v_02.u.ptr = in_stack_fffffffffffffd38;
                  v_02.tag._4_4_ = in_stack_fffffffffffffd44;
                  JS_FreeValue(in_stack_fffffffffffffd30,v_02);
                  iVar3 = JS_IsException(JVar5);
                  if (iVar3 != 0) goto LAB_001c5aee;
                }
                this_obj_00.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
                this_obj_00.u.float64 = in_stack_fffffffffffffd68.float64;
                val_00.u._4_4_ = in_stack_fffffffffffffd5c;
                val_00.u.int32 = in_stack_fffffffffffffd58;
                val_00.tag = (int64_t)in_stack_fffffffffffffd60;
                iVar3 = JS_SetPropertyInt64((JSContext *)in_stack_fffffffffffffd50.ptr,this_obj_00,
                                            (int64_t)in_stack_fffffffffffffd48,val_00);
                if (iVar3 < 0) goto LAB_001c5aee;
              }
              goto LAB_001c5b36;
            }
          }
        }
      }
    }
  }
  else {
    JVar4.u._4_4_ = in_stack_fffffffffffffd44;
    JVar4.u.int32 = in_stack_fffffffffffffd40;
    JVar4.tag = (int64_t)in_stack_fffffffffffffd48;
    iVar10 = check_function(in_stack_fffffffffffffd38,JVar4);
    if (iVar10 == 0) {
      iVar10 = 1;
      goto LAB_001c531a;
    }
  }
LAB_001c5aee:
  v_03.tag._0_4_ = in_stack_fffffffffffffd40;
  v_03.u.ptr = in_stack_fffffffffffffd38;
  v_03.tag._4_4_ = in_stack_fffffffffffffd44;
  JS_FreeValue(in_stack_fffffffffffffd30,v_03);
  in_stack_fffffffffffffd40 = 0;
  local_c0.ptr = (void *)((ulong)in_stack_fffffffffffffd44 << 0x20);
  local_b8 = 6;
LAB_001c5b36:
  v_04.tag._0_4_ = in_stack_fffffffffffffd40;
  v_04.u.ptr = in_stack_fffffffffffffd38;
  v_04.tag._4_4_ = in_stack_fffffffffffffd44;
  JS_FreeValue(in_stack_fffffffffffffd30,v_04);
  v_05.tag._0_4_ = in_stack_fffffffffffffd40;
  v_05.u.ptr = in_stack_fffffffffffffd38;
  v_05.tag._4_4_ = in_stack_fffffffffffffd44;
  JS_FreeValue(in_stack_fffffffffffffd30,v_05);
  v_06.tag._0_4_ = in_stack_fffffffffffffd40;
  v_06.u.ptr = in_stack_fffffffffffffd38;
  v_06.tag._4_4_ = in_stack_fffffffffffffd44;
  JS_FreeValue(in_stack_fffffffffffffd30,v_06);
  JVar1.tag = local_b8;
  JVar1.u.ptr = local_c0.ptr;
  return JVar1;
}

Assistant:

static JSValue js_typed_array_from(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, arr, r, v, v2;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arr = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        arr = JS_NewArray(ctx);
        if (JS_IsException(arr))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (JS_DefinePropertyValueInt64(ctx, arr, k, v, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arr = JS_ToObject(ctx, items);
        if (JS_IsException(arr))
            goto exception;
    }
    if (js_get_length64(ctx, &len, arr) < 0)
        goto exception;
    v = JS_NewInt64(ctx, len);
    args[0] = v;
    r = js_typed_array_create(ctx, this_val, 1, args);
    JS_FreeValue(ctx, v);
    if (JS_IsException(r))
        goto exception;
    for(k = 0; k < len; k++) {
        v = JS_GetPropertyInt64(ctx, arr, k);
        if (JS_IsException(v))
            goto exception;
        if (mapping) {
            args[0] = v;
            args[1] = JS_NewInt32(ctx, k);
            v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
            JS_FreeValue(ctx, v);
            v = v2;
            if (JS_IsException(v))
                goto exception;
        }
        if (JS_SetPropertyInt64(ctx, r, k, v) < 0)
            goto exception;
    }
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}